

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_linecurve.cpp
# Opt level: O3

bool __thiscall
ON_LineCurve::Evaluate
          (ON_LineCurve *this,double t,int der_count,int v_stride,double *v,int side,int *hint)

{
  ON_Interval *this_00;
  int iVar1;
  double *pdVar2;
  int iVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  ON_3dVector d;
  ON_3dPoint p;
  undefined1 local_68 [16];
  double local_58;
  ON_3dPoint local_48;
  
  this_00 = &this->m_t;
  dVar5 = ON_Interval::operator[](this_00,0);
  dVar6 = ON_Interval::operator[](this_00,1);
  if (dVar5 < dVar6) {
    dVar7 = ON_Interval::operator[](this_00,1);
    if ((dVar7 != t) || (NAN(dVar7) || NAN(t))) {
      dVar7 = ON_Interval::operator[](this_00,0);
      dVar9 = ON_Interval::operator[](this_00,1);
      dVar8 = ON_Interval::operator[](this_00,0);
      dVar7 = (t - dVar7) / (dVar9 - dVar8);
    }
    else {
      dVar7 = 1.0;
    }
    ON_Line::PointAt(&local_48,&this->m_line,dVar7);
    *v = local_48.x;
    v[1] = local_48.y;
    if (this->m_dim == 3) {
      v[2] = local_48.z;
    }
    if (0 < der_count) {
      lVar4 = (long)v_stride;
      ON_3dPoint::operator-((ON_3dVector *)local_68,&(this->m_line).to,&(this->m_line).from);
      dVar7 = ON_Interval::operator[](this_00,1);
      dVar9 = ON_Interval::operator[](this_00,0);
      dVar7 = dVar7 - dVar9;
      auVar10._8_8_ = dVar7;
      auVar10._0_8_ = dVar7;
      auVar10 = divpd(local_68,auVar10);
      *(undefined1 (*) [16])(v + lVar4) = auVar10;
      iVar1 = this->m_dim;
      if (iVar1 == 3) {
        v[lVar4 + 2] = local_58 / dVar7;
      }
      if (der_count != 1) {
        iVar3 = der_count + -1;
        pdVar2 = v + lVar4 * 2 + 2;
        do {
          pdVar2[-2] = 0.0;
          pdVar2[-1] = 0.0;
          if (iVar1 == 3) {
            *pdVar2 = 0.0;
          }
          pdVar2 = pdVar2 + lVar4;
          iVar3 = iVar3 + -1;
        } while (iVar3 != 0);
      }
    }
  }
  return dVar5 < dVar6;
}

Assistant:

bool ON_LineCurve::Evaluate( // returns false if unable to evaluate
       double t,       // evaluation parameter
       int der_count,  // number of derivatives (>=0)
       int v_stride,   // v[] array stride (>=Dimension())
       double* v,      // v[] array of length stride*(ndir+1)
       int side,       // optional - determines which side to evaluate from
                       //         0 = default
                       //      <  0 to evaluate from below, 
                       //      >  0 to evaluate from above
       int* hint       // optional - evaluation hint (int) used to speed
                       //            repeated evaluations
       ) const
{
  bool rc = false;
  if ( m_t[0] < m_t[1] ) {
    double s = (t == m_t[1]) ? 1.0 : (t-m_t[0])/(m_t[1]-m_t[0]);
    const ON_3dPoint p = m_line.PointAt(s);
    v[0] = p.x;
    v[1] = p.y;
    if ( m_dim == 3 )
      v[2] = p.z;
    if ( der_count >= 1 ) 
    {
      v += v_stride;
      ON_3dVector d = m_line.to - m_line.from;
      double dt = m_t[1] - m_t[0];
      v[0] = d.x/dt;
      v[1] = d.y/dt;
      if ( m_dim == 3 )
        v[2] = d.z/dt;
      for ( int di = 2; di <= der_count; di++ ) {
        v += v_stride;
        v[0] = 0.0;
        v[1] = 0.0;
        if ( m_dim == 3 )
          v[2] = 0.0;
      }
    }
    rc = true;
  }
  return rc;
}